

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcknowledgePdu.cpp
# Opt level: O1

int __thiscall DIS::AcknowledgePdu::getMarshalledSize(AcknowledgePdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = SimulationManagementFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_originatingID);
  iVar3 = EntityID::getMarshalledSize(&this->_receivingID);
  return iVar3 + iVar2 + iVar1 + 8;
}

Assistant:

int AcknowledgePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _originatingID.getMarshalledSize();  // _originatingID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID
   marshalSize = marshalSize + 2;  // _acknowledgeFlag
   marshalSize = marshalSize + 2;  // _responseFlag
   marshalSize = marshalSize + 4;  // _requestID
    return marshalSize;
}